

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int fixupReg(InternalInstruction *insn,OperandSpecifier *op)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  EABase EVar4;
  int iVar5;
  uint8_t uVar6;
  bool bVar7;
  uint8_t valid;
  bool local_19;
  
  bVar2 = op->encoding;
  iVar5 = -1;
  if (6 < bVar2 - 2) {
    if (bVar2 == 1) {
      bVar2 = fixupRegValue(insn,(uint)op->type,(char)insn->reg - (char)insn->regBase,&local_19);
      insn->reg = (uint)bVar2;
    }
    else {
      if (bVar2 != 9) {
        return -1;
      }
      bVar2 = fixupRegValue(insn,(uint)op->type,(char)insn->vvvv,&local_19);
      insn->vvvv = (uint)bVar2;
    }
    if (local_19 == false) {
      return -1;
    }
    goto LAB_001a70b0;
  }
  EVar4 = insn->eaBase;
  uVar3 = EVar4 - insn->eaRegBase;
  if (EVar4 < insn->eaRegBase) goto LAB_001a70b0;
  bVar2 = op->type;
  bVar7 = true;
  bVar1 = (byte)uVar3;
  switch(bVar2 - 0x39) {
  case 0:
  case 3:
switchD_001a6f2d_caseD_0:
    uVar6 = '\x02';
    break;
  case 1:
  case 4:
  case 0x13:
switchD_001a6f2d_caseD_1:
    uVar6 = '\x04';
    break;
  case 2:
  case 5:
switchD_001a6f2d_caseD_2:
    uVar6 = '\b';
    break;
  case 6:
    uVar6 = '\x10';
    break;
  case 7:
    uVar6 = ' ';
    break;
  case 8:
    uVar6 = '@';
    break;
  case 9:
  case 0xc:
  case 0xd:
    goto switchD_001a6f2d_caseD_9;
  case 10:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x14:
    goto switchD_001a6f2d_caseD_a;
  case 0x11:
    goto switchD_001a6f2d_caseD_11;
  case 0x12:
    goto switchD_001a6f2d_caseD_12;
  case 0x15:
    goto switchD_001a6f2d_caseD_15;
  default:
    switch(bVar2) {
    case 8:
      uVar6 = '\x01';
      goto LAB_001a6fe4;
    case 9:
      goto switchD_001a6f2d_caseD_0;
    case 10:
      goto switchD_001a6f2d_caseD_1;
    case 0xb:
      goto switchD_001a6f2d_caseD_2;
    }
    goto switchD_001a6f2d_caseD_a;
  }
LAB_001a6fe4:
  insn->operandSize = uVar6;
  switch(bVar2 - 0x39) {
  case 0:
  case 1:
  case 2:
    EVar4 = (uVar3 & 7) + EA_REG_MM0;
    break;
  case 3:
  case 4:
  case 5:
  case 6:
    EVar4 = uVar3 + EA_REG_XMM0;
    break;
  case 7:
    EVar4 = uVar3 + EA_REG_YMM0;
    break;
  case 8:
    EVar4 = uVar3 + EA_REG_ZMM0;
    break;
  case 9:
  case 0xc:
  case 0xd:
switchD_001a6f2d_caseD_9:
    bVar7 = bVar1 < 8;
    EVar4 = uVar3 + EA_REG_K0;
    break;
  case 10:
  case 0xb:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x14:
switchD_001a6f2d_caseD_a:
    bVar7 = false;
    EVar4 = EA_BASE_NONE;
    break;
  case 0x11:
switchD_001a6f2d_caseD_11:
    bVar7 = bVar1 < 6;
    EVar4 = uVar3 + EA_REG_ES;
    break;
  case 0x12:
switchD_001a6f2d_caseD_12:
    bVar7 = bVar1 < 8;
    EVar4 = uVar3 + EA_REG_DR0;
    break;
  case 0x13:
    EVar4 = uVar3 + EA_REG_CR0;
    break;
  case 0x15:
    break;
  default:
    switch(bVar2) {
    case 8:
      if (((bVar1 & 0xfc) == 4) && (insn->rexPrefix != '\0')) {
        EVar4 = uVar3 + EA_REG_R12B;
      }
      else {
        EVar4 = uVar3 + EA_REG_AL;
      }
      break;
    case 9:
      EVar4 = uVar3 + EA_REG_AX;
      break;
    case 10:
      EVar4 = uVar3 + EA_REG_EAX;
      break;
    case 0xb:
      EVar4 = uVar3 + EA_REG_RAX;
      break;
    default:
      goto switchD_001a6f2d_caseD_a;
    }
  }
switchD_001a6f2d_caseD_15:
  insn->eaBase = EVar4 & EA_REG_CR12;
  if (bVar7) {
LAB_001a70b0:
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int fixupReg(struct InternalInstruction *insn,
		const struct OperandSpecifier *op)
{
	uint8_t valid;

	// dbgprintf(insn, "fixupReg()");

	switch ((OperandEncoding)op->encoding) {
		default:
			//debug("Expected a REG or R/M encoding in fixupReg");
			return -1;
		case ENCODING_VVVV:
			insn->vvvv = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					insn->vvvv,
					&valid);
			if (!valid)
				return -1;
			break;
		case ENCODING_REG:
			insn->reg = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					(uint8_t)(insn->reg - insn->regBase),
					&valid);
			if (!valid)
				return -1;
			break;
		CASE_ENCODING_RM:
			if (insn->eaBase >= insn->eaRegBase) {
				insn->eaBase = (EABase)fixupRMValue(insn,
						(OperandType)op->type,
						(uint8_t)(insn->eaBase - insn->eaRegBase),
						&valid);
				if (!valid)
					return -1;
			}
			break;
	}

	return 0;
}